

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::SAT(SAT *this)

{
  rep rVar1;
  SClause *pSVar2;
  Clause *pCVar3;
  Clause *pCVar4;
  int local_3c;
  double local_38;
  
  (this->super_Branching)._vptr_Branching = (_func_int **)&PTR_finished_001f3868;
  (this->lit_sort).level = &this->trailpos;
  memset(&this->clauses,0,0x88);
  (this->var_free_list).sz = 0;
  (this->var_free_list).cap = 0;
  (this->var_free_list).data = (int *)0x0;
  (this->num_used).sz = 0;
  (this->num_used).cap = 0;
  (this->num_used).data = (int *)0x0;
  vec<vec<Lit>_>::vec(&this->trail,1);
  local_3c = 0;
  vec<int>::vec(&this->qhead,1,&local_3c);
  vec<vec<Clause_*>_>::vec(&this->rtrail,1);
  this->confl = (Clause *)0x0;
  (this->out_learnt).sz = 0;
  (this->out_learnt).cap = 0;
  (this->out_learnt).data = (Lit *)0x0;
  (this->out_learnt_level).sz = 0;
  (this->out_learnt_level).cap = 0;
  (this->out_learnt_level).data = (int *)0x0;
  (this->seen).sz = 0;
  (this->seen).cap = 0;
  (this->seen).data = (char *)0x0;
  (this->ivseen).sz = 0;
  (this->ivseen).cap = 0;
  (this->ivseen).data = (bool *)0x0;
  (this->ivseen_toclear).sz = 0;
  (this->ivseen_toclear).cap = 0;
  (this->ivseen_toclear).data = (int *)0x0;
  (this->analyze_stack).sz = 0;
  (this->analyze_stack).cap = 0;
  (this->analyze_stack).data = (Lit *)0x0;
  (this->analyze_toclear).sz = 0;
  (this->analyze_toclear).cap = 0;
  (this->analyze_toclear).data = (Lit *)0x0;
  (this->min_vars).sz = 0;
  (this->min_vars).cap = 0;
  (this->min_vars).data = (IntVar **)0x0;
  this->var_inc = 1.0;
  this->cla_inc = 1.0;
  (this->activity).sz = 0;
  (this->activity).cap = 0;
  (this->activity).data = (double *)0x0;
  (this->order_heap).lt.activity = &this->activity;
  (this->order_heap).heap.sz = 0;
  (this->order_heap).heap.cap = 0;
  (this->order_heap).heap.data = (int *)0x0;
  (this->order_heap).indices.sz = 0;
  (this->order_heap).indices.cap = 0;
  (this->order_heap).indices.data = (int *)0x0;
  (this->polarity).sz = 0;
  (this->polarity).cap = 0;
  (this->polarity).data = (bool *)0x0;
  this->bin_clauses = 0;
  this->tern_clauses = 0;
  this->long_clauses = 0;
  this->learnt_clauses = 0;
  this->propagations = 0;
  this->back_jumps = 0;
  this->nrestarts = 0;
  this->next_simp_db = 100000;
  this->max_literals = 0;
  this->tot_literals = 0;
  this->clauses_literals = 0;
  this->learnts_literals = 0;
  this->avg_depth = 100.0;
  this->confl_rate = 1000.0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->ll_time).__d.__r = rVar1;
  this->ll_inc = 1.0;
  this->learnt_len_el = 10.0;
  local_38 = 19.53125;
  vec<double>::vec(&this->learnt_len_occ,0x200,&local_38);
  newVar(this,1,::ci_null);
  enqueue(this,(Lit)0x1,(Reason)0x0);
  newVar(this,1,::ci_null);
  enqueue(this,(Lit)0x2,(Reason)0x0);
  pSVar2 = (SClause *)malloc(0x1000);
  this->temp_sc = pSVar2;
  pCVar3 = (Clause *)malloc(0x14);
  this->short_expl = pCVar3;
  pCVar4 = (Clause *)malloc(0x10);
  this->short_confl = pCVar4;
  *(undefined4 *)pCVar3 = 0;
  *(undefined4 *)pCVar4 = 0x200;
  return;
}

Assistant:

SAT::SAT()
		: lit_sort(trailpos),
			pushback_time(duration::zero()),
			trail(1),
			qhead(1, 0),
			rtrail(1),

			order_heap(VarOrderLt(activity)),

			ll_time(chuffed_clock::now()),

			learnt_len_occ(MAX_SHARE_LEN, learnt_len_el * 1000 / MAX_SHARE_LEN) {
	newVar();
	enqueue(Lit(0, true));
	newVar();
	enqueue(Lit(1, false));
	temp_sc = (SClause*)malloc(TEMP_SC_LEN * sizeof(int));
	short_expl = (Clause*)malloc(sizeof(Clause) + 3 * sizeof(Lit));
	short_confl = (Clause*)malloc(sizeof(Clause) + 2 * sizeof(Lit));
	short_expl->clearFlags();
	short_confl->clearFlags();
	short_confl->sz = 2;
}